

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params params,unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params params_00;
  ZSTD_CDict *pZVar4;
  size_t sVar5;
  long lVar6;
  ZSTD_CCtx_params *pZVar7;
  undefined8 *puVar8;
  byte bVar9;
  undefined8 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff34;
  ZSTD_allocFunction in_stack_ffffffffffffff38;
  ZSTD_freeFunction in_stack_ffffffffffffff40;
  void *in_stack_ffffffffffffff48;
  undefined1 auVar10 [24];
  undefined1 in_stack_ffffffffffffff50 [64];
  undefined1 auVar11 [24];
  
  bVar9 = 0;
  if (dictSize < 8 || dict == (void *)0x0) {
    if (cdict != (ZSTD_CDict *)0x0) {
      params.cParams.windowLog = (cdict->cParams).windowLog;
      params.cParams.chainLog = (cdict->cParams).chainLog;
      uVar1 = (cdict->cParams).hashLog;
      uVar2 = (cdict->cParams).searchLog;
      uVar3 = (cdict->cParams).searchLength;
      params.cParams.targetLength = (cdict->cParams).targetLength;
      params.cParams.strategy = (cdict->cParams).strategy;
      params.cParams.hashLog = uVar1;
      params.cParams.searchLog = uVar2;
      params.cParams.searchLength = uVar3;
    }
    ZSTD_freeCDict(zcs->cdictLocal);
    zcs->cdictLocal = (ZSTD_CDict *)0x0;
    zcs->cdict = cdict;
  }
  else {
    if (zcs->staticSize != 0) {
      return 0xffffffffffffffc0;
    }
    ZSTD_freeCDict(zcs->cdictLocal);
    in_stack_ffffffffffffff48 = (zcs->customMem).opaque;
    in_stack_ffffffffffffff38 = (zcs->customMem).customAlloc;
    in_stack_ffffffffffffff40 = (zcs->customMem).customFree;
    cParams.hashLog = params.cParams.hashLog;
    cParams.windowLog = params.cParams.windowLog;
    cParams.chainLog = params.cParams.chainLog;
    cParams.searchLog = params.cParams.searchLog;
    cParams.searchLength = params.cParams.searchLength;
    cParams.targetLength = params.cParams.targetLength;
    cParams.strategy = params.cParams.strategy;
    in_stack_ffffffffffffff18 = params.cParams._0_8_;
    in_stack_ffffffffffffff20 = params.cParams.hashLog;
    in_stack_ffffffffffffff24 = params.cParams.searchLog;
    in_stack_ffffffffffffff28 = params.cParams.searchLength;
    in_stack_ffffffffffffff2c = params.cParams._20_8_;
    pZVar4 = ZSTD_createCDict_advanced
                       (dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto,cParams,zcs->customMem);
    zcs->cdictLocal = pZVar4;
    zcs->cdict = pZVar4;
    if (pZVar4 == (ZSTD_CDict *)0x0) {
      return 0xffffffffffffffc0;
    }
  }
  pZVar4 = zcs->cdict;
  pZVar7 = &params;
  puVar8 = (undefined8 *)&stack0xffffffffffffff18;
  for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *(undefined8 *)pZVar7;
    pZVar7 = (ZSTD_CCtx_params *)((long)pZVar7 + (ulong)bVar9 * -0x10 + 8);
    puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
  }
  params_00.cParams.chainLog = in_stack_ffffffffffffff20;
  params_00.format = (uint)in_stack_ffffffffffffff18;
  params_00.cParams.windowLog = SUB84(in_stack_ffffffffffffff18,4);
  params_00.cParams.hashLog = in_stack_ffffffffffffff24;
  params_00.cParams.searchLog = in_stack_ffffffffffffff28;
  params_00.cParams.searchLength = (uint)in_stack_ffffffffffffff2c;
  params_00.cParams.targetLength = SUB84(in_stack_ffffffffffffff2c,4);
  params_00.cParams.strategy = in_stack_ffffffffffffff34;
  params_00.fParams._0_8_ = in_stack_ffffffffffffff38;
  params_00._40_8_ = in_stack_ffffffffffffff40;
  params_00._48_8_ = in_stack_ffffffffffffff48;
  auVar10 = in_stack_ffffffffffffff50._12_24_;
  auVar11 = in_stack_ffffffffffffff50._40_24_;
  params_00.nbWorkers = in_stack_ffffffffffffff50._0_4_;
  params_00.jobSize = in_stack_ffffffffffffff50._4_4_;
  params_00.overlapSizeLog = in_stack_ffffffffffffff50._8_4_;
  params_00.ldmParams.enableLdm = auVar10._0_4_;
  params_00.ldmParams.hashLog = auVar10._4_4_;
  params_00.ldmParams.bucketSizeLog = auVar10._8_4_;
  params_00.ldmParams.minMatchLength = auVar10._12_4_;
  params_00.ldmParams.hashEveryLog = auVar10._16_4_;
  params_00.ldmParams.windowLog = auVar10._20_4_;
  params_00._92_4_ = in_stack_ffffffffffffff50._36_4_;
  params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar11._0_8_;
  params_00.customMem.customFree = (ZSTD_freeFunction)auVar11._8_8_;
  params_00.customMem.opaque = (void *)auVar11._16_8_;
  sVar5 = ZSTD_compressBegin_internal
                    (zcs,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,pZVar4,params_00,pledgedSrcSize,
                     ZSTDb_buffered);
  if (sVar5 < 0xffffffffffffff89) {
    zcs->inToCompress = 0;
    zcs->inBuffPos = 0;
    zcs->inBuffTarget = (ulong)(zcs->blockSize == pledgedSrcSize) + zcs->blockSize;
    zcs->outBuffContentSize = 0;
    zcs->outBuffFlushedSize = 0;
    zcs->streamStage = zcss_load;
    zcs->frameEnded = 0;
    sVar5 = 0;
  }
  return sVar5;
}

Assistant:

size_t ZSTD_initCStream_internal(ZSTD_CStream* zcs,
                    const void* dict, size_t dictSize, const ZSTD_CDict* cdict,
                    ZSTD_CCtx_params params, unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_internal");
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    if (dict && dictSize >= 8) {
        DEBUGLOG(4, "loading dictionary of size %u", (U32)dictSize);
        if (zcs->staticSize) {   /* static CCtx : never uses malloc */
            /* incompatible with internal cdict creation */
            return ERROR(memory_allocation);
        }
        ZSTD_freeCDict(zcs->cdictLocal);
        zcs->cdictLocal = ZSTD_createCDict_advanced(dict, dictSize,
                                            ZSTD_dlm_byCopy, ZSTD_dct_auto,
                                            params.cParams, zcs->customMem);
        zcs->cdict = zcs->cdictLocal;
        if (zcs->cdictLocal == NULL) return ERROR(memory_allocation);
    } else {
        if (cdict) {
            params.cParams = ZSTD_getCParamsFromCDict(cdict);  /* cParams are enforced from cdict; it includes windowLog */
        }
        ZSTD_freeCDict(zcs->cdictLocal);
        zcs->cdictLocal = NULL;
        zcs->cdict = cdict;
    }

    return ZSTD_resetCStream_internal(zcs, NULL, 0, ZSTD_dct_auto, zcs->cdict, params, pledgedSrcSize);
}